

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-model-base-flex-estimation.hxx
# Opt level: O0

IndexedVectorArray *
stateObservation::examples::offlineModelBaseFlexEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,IndexedVectorArray *u,
          Matrix *xh0,IndexedVectorArray *numberOfContacts,double dt,double mass,bool withForce,
          IndexedMatrixArray *Q,IndexedMatrixArray *R,Matrix3 *kfe,Matrix3 *kfv,Matrix3 *kte,
          Matrix3 *ktv,IndexedVectorArray *prediction,IndexedVectorArray *ino,
          IndexedVectorArray *premea,IndexedVectorArray *simumea,int verbose)

{
  undefined8 uVar1;
  bool bVar2;
  TimeSize TVar3;
  TimeIndex TVar4;
  Scalar *pSVar5;
  ostream *poVar6;
  void *pvVar7;
  Index IVar8;
  long lVar9;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  non_const_type local_1950;
  Matrix<double,__1,_1,_0,__1,_1> local_1948;
  Matrix<double,__1,_1,_0,__1,_1> local_1938;
  Matrix<double,__1,_1,_0,__1,_1> local_1928;
  Matrix<double,__1,_1,_0,__1,_1> local_1918;
  undefined1 local_1908 [8];
  Vector xhk;
  Matrix<double,__1,__1,_0,__1,__1> local_18e0;
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [16];
  Type local_18a8;
  Matrix<double,__1,_1,_0,__1,_1> local_1870;
  undefined1 local_1860 [16];
  non_const_type local_1850;
  undefined1 local_1848 [16];
  non_const_type local_1838;
  undefined1 local_1830 [16];
  non_const_type local_1820;
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [24];
  TimeIndex i;
  undefined1 local_17b9;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_17b8 [16];
  Matrix<double,__1,__1,_0,__1,__1> local_17a8;
  Matrix<double,__1,__1,_0,__1,__1> local_1790;
  byte local_1776;
  byte local_1775;
  bool customR;
  bool customQ;
  ModelBaseEKFFlexEstimatorIMU local_1768 [8];
  ModelBaseEKFFlexEstimatorIMU estimator;
  bool withForce_local;
  double mass_local;
  double dt_local;
  IndexedVectorArray *numberOfContacts_local;
  Matrix *xh0_local;
  IndexedVectorArray *u_local;
  IndexedVectorArray *y_local;
  IndexedVectorArray *xh;
  
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ModelBaseEKFFlexEstimatorIMU(local_1768,0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactModel
            ((uint)local_1768);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(dt);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setRobotMass(mass);
  local_1775 = 0;
  local_1776 = 0;
  TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(Q);
  if (TVar3 == 1) {
    TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::getFirstIndex(Q);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::operator[](&local_1790,Q,TVar4);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setProcessNoiseCovariance
              ((Matrix *)local_1768);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1790);
  }
  TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(R);
  if (TVar3 == 1) {
    TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::getFirstIndex(R);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::operator[](&local_17a8,R,TVar4);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
    setMeasurementNoiseCovariance((Matrix *)local_1768);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_17a8);
  }
  TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(Q);
  if (1 < TVar3) {
    local_1775 = 1;
  }
  TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(R);
  if (1 < TVar3) {
    local_1776 = 1;
  }
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)local_1768);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces
            (SUB81(local_1768,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements
            (SUB81(local_1768,0));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator!=
                    ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)kfe,local_17b8);
  if (bVar2) {
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfe
              ((Matrix *)local_1768);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfv
              ((Matrix *)local_1768);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKte
              ((Matrix *)local_1768);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKtv
              ((Matrix *)local_1768);
  }
  local_17b9 = 0;
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(__return_storage_ptr__);
  TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::getFirstIndex(y);
  if (0 < TVar4) {
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&i,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)xh0);
    TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::getFirstIndex(y);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(__return_storage_ptr__,(Matrix<double,__1,_1,_0,__1,_1> *)&i,TVar4 + -1);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&i);
  }
  for (local_17e8._16_8_ =
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::getFirstIndex(y); uVar1 = local_17e8._16_8_,
      TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::getNextIndex(y), (long)uVar1 < TVar4;
      local_17e8._16_8_ =
           (long)&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_17e8._16_8_)->
                  m_storage).m_data + 1) {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_17e8,(TimeIndex)numberOfContacts);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_17e8,0);
    round(*pSVar5);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
              ((uint)local_1768);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_17e8);
    if ((0 < verbose) && (((long)local_17e8._16_8_ % 1000 == 0 || (1 < verbose)))) {
      poVar6 = std::operator<<((ostream *)&std::cout,"iteration: ");
      pvVar7 = (void *)std::ostream::operator<<(poVar6,local_17e8._16_8_);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      if (2 < verbose) {
        poVar6 = std::operator<<((ostream *)&std::cout,"number of contacts: ");
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_17f8,(TimeIndex)numberOfContacts);
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                          local_17f8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_17f8);
        poVar6 = std::operator<<((ostream *)&std::cout,"size of the measurement: ");
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_1808,(TimeIndex)y);
        IVar8 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1808);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,IVar8);
        poVar6 = std::operator<<(poVar6,", supposed to be ");
        lVar9 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
                getMeasurementSize();
        pvVar7 = (void *)std::ostream::operator<<(poVar6,lVar9);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_1808);
        poVar6 = std::operator<<((ostream *)&std::cout,"size of the input: ");
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_1818,(TimeIndex)u);
        IVar8 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1818);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,IVar8);
        poVar6 = std::operator<<(poVar6,", supposed to be ");
        lVar9 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getInputSize
                          ();
        pvVar7 = (void *)std::ostream::operator<<(poVar6,lVar9);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_1818);
        if (3 < verbose) {
          poVar6 = std::operator<<((ostream *)&std::cout,"numberOfContacts: ");
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_1830,(TimeIndex)numberOfContacts);
          local_1820 = (non_const_type)
                       Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1830);
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                             *)&local_1820);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_1830);
          poVar6 = std::operator<<((ostream *)&std::cout,"Measurement: ");
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_1848,(TimeIndex)y);
          local_1838 = (non_const_type)
                       Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1848);
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                             *)&local_1838);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_1848);
          poVar6 = std::operator<<((ostream *)&std::cout,"Input: ");
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_1860,(TimeIndex)u);
          local_1850 = (non_const_type)
                       Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1860);
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                             *)&local_1850);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_1860);
        }
      }
    }
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_18b8,(TimeIndex)y);
    lVar9 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
            getMeasurementSize();
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
              (&local_18a8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_18b8,lVar9);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_1870,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_18a8);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)local_1768);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1870);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_18b8);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_18c8,(TimeIndex)u);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)local_1768);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_18c8);
    if ((local_1775 & 1) != 0) {
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[](&local_18e0,Q,local_17e8._16_8_);
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
      setProcessNoiseCovariance((Matrix *)local_1768);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_18e0);
    }
    if ((local_1776 & 1) != 0) {
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[]((Matrix<double,__1,__1,_0,__1,__1> *)
                   &xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,R,local_17e8._16_8_);
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
      setMeasurementNoiseCovariance((Matrix *)local_1768);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)
                 &xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
    }
    other = (Matrix<double,__1,_1,_0,__1,_1> *)
            stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
            getFlexibilityVector();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_1908,other);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::pushBack(__return_storage_ptr__,(Matrix<double,__1,_1,_0,__1,_1> *)local_1908);
    if (prediction != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getLastPrediction();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(prediction,&local_1918,local_17e8._16_8_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1918);
    }
    if (ino != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInnovation();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(ino,&local_1928,local_17e8._16_8_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1928);
    }
    if (premea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
      getLastPredictedMeasurement();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(premea,&local_1938,local_17e8._16_8_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1938);
    }
    if (simumea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getSimulatedMeasurement
                ();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(simumea,&local_1948,local_17e8._16_8_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1948);
    }
    if (1 < verbose) {
      std::operator<<((ostream *)&std::cout,"Success");
      if (2 < verbose) {
        poVar6 = std::operator<<((ostream *)&std::cout,", rebuilt state ");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_1950 = (non_const_type)
                     Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1908);
        Eigen::operator<<((ostream *)&std::cout,
                          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                          &local_1950);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_1908);
  }
  local_17b9 = 1;
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ~ModelBaseEKFFlexEstimatorIMU(local_1768);
  return __return_storage_ptr__;
}

Assistant:

stateObservation::IndexedVectorArray offlineModelBaseFlexEstimation(
  const stateObservation::IndexedVectorArray & y,
  const stateObservation::IndexedVectorArray & u,
  const Matrix & xh0,
  const stateObservation::IndexedVectorArray numberOfContacts,
  double dt,
  double mass,
  bool withForce,
  const stateObservation::IndexedMatrixArray & Q,
  const stateObservation::IndexedMatrixArray & R,
  const Matrix3 & kfe,
  const Matrix3 & kfv,
  const Matrix3 & kte,
  const Matrix3 & ktv,
  IndexedVectorArray * prediction,
  IndexedVectorArray * ino,
  IndexedVectorArray * premea,
  IndexedVectorArray * simumea,
  int verbose)
{


  flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU estimator;

  estimator.setContactModel(flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::contactModel::elasticContact);
  estimator.setSamplingPeriod(dt);
  estimator.setRobotMass(mass);

  bool customQ = false,
       customR = false;

  if (Q.size()==1)
  {
    estimator.setProcessNoiseCovariance(Q[Q.getFirstIndex()]);
  }
  if (R.size()==1)
  {
    estimator.setMeasurementNoiseCovariance(R[R.getFirstIndex()]);
  }

  if (Q.size()>1)
  {
    customQ=true;
  }
  if (R.size()>1)
  {
    customR=true;
  }



//  Matrix Ri,Qi,P;
//
//  int measurementSize=6;
//  int stateSize=flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::size;
//
//  double acceleroCovariance=acc_cov_const;
//  double gyroCovariance=gyr_cov_const;
//  double posStateCov=pos_state_cov_const;
//  double oristateCov=ori_state_cov_const;
//  double velStateCov=vel_state_cov_const;
//  double angvStateCov=angv_state_cov_const;
//  double stateForceCov=state_fc_const;



//  Ri.noalias()=Matrix::Identity(measurementSize,measurementSize)*acceleroCovariance;
//  Ri(3,3)=R(4,4)=R(5,5)=gyroCovariance;
//  Qi.noalias()=Matrix::Identity(stateSize,stateSize)*posStateCov;
//
//  Qi.diagonal().segment<3>(state::ori).setConstant(oristateCov);
//
//  Qi.diagonal().segment<3>(state::linVel).setConstant(velStateCov);
//  Qi.diagonal().segment<3>(state::angVel).setConstant(angvStateCov);
//  Qi.diagonal().segment<12>(state::fc).setConstant(stateForceCov);
//
//  estimator.setProcessNoiseCovariance(Qi);
//  estimator.setMeasurementNoiseCovariance(Ri);
//  Matrix forcevariance= Matrix::Identity(6,6)*force_sensor_const;
//  forcevariance.block(3,3,3,3)=Matrix::Identity(3,3)*torque_sensor_const;
//  /// consider the vertical torque as reliable as a force
//  forcevariance(2,2)=torque_sensor_const;
//  /// consider the vertical force as reliable as torque
//  forcevariance(6,6)=force_sensor_const;
//  estimator.setForceVariance(forcevariance);



  estimator.setFlexibilityGuess(xh0);

  estimator.setWithUnmodeledForces(true);


  estimator.setWithForcesMeasurements(withForce);


  if (kfe!=Matrix3::Zero())
  {
    estimator.setKfe(kfe);
    estimator.setKfv(kfv);
    estimator.setKte(kte);
    estimator.setKtv(ktv);
  }

  ///the array of the state estimations over time
  stateObservation::IndexedVectorArray xh;
  if (y.getFirstIndex()>0)
    xh.setValue(xh0,y.getFirstIndex()-1);

  ///the reconstruction of the state
  for (TimeIndex i=y.getFirstIndex(); i<y.getNextIndex(); ++i)
  {

    estimator.setContactsNumber(unsigned(round(numberOfContacts[i](0))));

    if (verbose>0)
    {
      if (i%1000==0 || verbose >1)
      {
        std::cout << "iteration: " << i  << std::endl ;

        if (verbose >2)
        {
          std::cout << "number of contacts: "<< numberOfContacts[i]<< std::endl;
          std::cout << "size of the measurement: "<< y[i].size()
                    << ", supposed to be " << estimator.getMeasurementSize() << std::endl;
          std::cout << "size of the input: "<< u[i].size()
                    << ", supposed to be " << estimator.getInputSize() << std::endl;

          if (verbose > 3)
          {
            std::cout << "numberOfContacts: " << numberOfContacts[i].transpose() << std::endl;
            std::cout << "Measurement: " << y[i].transpose() << std::endl;
            std::cout << "Input: " << u[i].transpose() << std::endl;
          }
        }
      }
    }

    ///introduction of the measurement
    estimator.setMeasurement(Vector(y[i]).head(estimator.getMeasurementSize()));

    estimator.setMeasurementInput(u[i]);

    ///initialize flexibility
    if (customQ)
    {
      estimator.setProcessNoiseCovariance(Q[i]);
    }

    if (customR)
    {
      estimator.setMeasurementNoiseCovariance(R[i]);
    }

    ///get the estimation and give it to the array
    Vector xhk=estimator.getFlexibilityVector();

    xh.pushBack(xhk);

    if (prediction != 0x0)
    {
      prediction->setValue(estimator.getLastPrediction(),i);
    }

    if (ino != 0x0)
    {
      ino->setValue(estimator.getInnovation(),i);
    }

    if (premea != 0x0)
    {
      premea->setValue(estimator.getLastPredictedMeasurement(),i);
    }

    if (simumea != 0x0)
    {
      simumea->setValue(estimator.getSimulatedMeasurement(),i);
    }

    if (verbose >1)
    {
      std::cout << "Success";
      if (verbose >2)
      {
        std::cout << ", rebuilt state "<<std::endl;
        std::cout << xhk.transpose();
      }

      std::cout<<std::endl;

    }

  }

  return xh;
}